

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O2

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::splitFrom
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  tCharPtr pcVar1;
  uint _length;
  char in_CL;
  undefined7 in_register_00000011;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  uint uVar3;
  VerySimpleReadOnlyString VVar4;
  
  _length = Find(find,(VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind),0);
  if (_length == find->length) {
    uVar2 = extraout_RDX;
    if (in_CL == '\0') {
      this->data = "";
      this->length = 0;
    }
    else {
      pcVar1 = find->data;
      this->data = pcVar1;
      this->length = _length;
      find->data = pcVar1 + (int)_length;
      find->length = 0;
    }
  }
  else {
    uVar3 = ((VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind))->length +
            _length;
    if (in_CL != '\0') {
      _length = uVar3;
    }
    VerySimpleReadOnlyString(this,find->data,_length);
    find->data = find->data + (int)uVar3;
    find->length = find->length - uVar3;
    uVar2 = extraout_RDX_00;
  }
  VVar4._8_8_ = uVar2;
  VVar4.data = (tCharPtr)this;
  return VVar4;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::splitFrom(const VerySimpleReadOnlyString & find, const bool includeFind)
	{
	    const unsigned int pos = Find(find);
	    if (pos == (unsigned int)length)
	    {
	        if (includeFind)
	        {
	            VerySimpleReadOnlyString ret(*this);
                (void)Mutate(data + length, 0);
	            return ret;
	        }
	        return VerySimpleReadOnlyString("", 0);
	    }
	    const int size = pos + find.length;
	    VerySimpleReadOnlyString ret(data, includeFind ? size : pos);
        (void)Mutate(data + size, length - size);
	    return ret;
	}